

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::chooseRow(HDual *this)

{
  HVector *this_00;
  int iVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  long lVar4;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  if (this->invertHint != 0) {
    return;
  }
  this_00 = &this->row_ep;
  while( true ) {
    HDualRHS::choose_normal(&this->dualRHS,&this->rowOut);
    if (this->rowOut == -1) {
      this->invertHint = 3;
      return;
    }
    uVar2 = rdtsc();
    uVar5 = (undefined4)((ulong)uVar2 >> 0x20);
    auVar3._4_4_ = uVar5;
    auVar3._0_4_ = uVar5;
    auVar3._8_4_ = 0;
    auVar8._0_12_ = auVar3 << 0x20;
    auVar8._12_4_ = 0x45300000;
    (this->model->timer).itemStart[0x11] =
         (auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    HVector::clear(this_00);
    (this->row_ep).count = 1;
    iVar1 = this->rowOut;
    *(this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = iVar1;
    (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar1] = 1.0;
    (this->row_ep).packFlag = true;
    HFactor::btran(this->factor,this_00,this->row_epDensity);
    HTimer::recordFinish(&this->model->timer,0x11);
    lVar4 = (long)this->rowOut;
    if (this->EdWt_Mode != 0) break;
    dVar7 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4];
    dVar6 = HVector::norm2(this_00);
    lVar4 = (long)this->rowOut;
    (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4] = dVar6;
    if (dVar6 * 0.25 <= dVar7) break;
    this->n_wg_DSE_wt = this->n_wg_DSE_wt + 1;
  }
  this->columnOut =
       (this->model->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar4];
  dVar7 = this->baseLower[lVar4];
  if (dVar7 <= this->baseValue[lVar4]) {
    dVar7 = this->baseUpper[lVar4];
  }
  dVar7 = this->baseValue[lVar4] - dVar7;
  this->deltaPrimal = dVar7;
  this->sourceOut = (uint)(0.0 <= dVar7) * 2 + -1;
  this->row_epDensity =
       ((double)(this->row_ep).count * 0.05) / (double)this->numRow + this->row_epDensity * 0.95;
  return;
}

Assistant:

void HDual::chooseRow() {
	if (invertHint)
		return;
	for (;;) {
		// Choose row
		dualRHS.choose_normal(&rowOut);
		if (rowOut == -1) {
			invertHint = invertHint_possiblyOptimal; // Was 1
			return;
		}

		// Verify weight
		model->timer.recordStart(HTICK_BTRAN);
		row_ep.clear();
		row_ep.count = 1;
		row_ep.index[0] = rowOut;
		row_ep.array[rowOut] = 1;
		row_ep.packFlag = true;
		factor->btran(row_ep, row_epDensity);
		model->timer.recordFinish(HTICK_BTRAN);
		if (EdWt_Mode == EdWt_Mode_DSE) {
			//For DSE compute the correct weight c_weight and use if to see how
			//accurate the updated weight is.
			double u_weight = dualRHS.workEdWt[rowOut];
			double c_weight = dualRHS.workEdWt[rowOut] = row_ep.norm2();
			//For DSE compute the correct weight c_weight and use if to see how
			//accurate the updated weight is.
#ifdef JAJH_dev
			//			double DSE_wt_er = abs((u_weight - c_weight) / max(u_weight, c_weight));
			//if (DSE_wt_er > 1e-2)
			//			  printf(
			//	 " !! JAJH RARE PRINT: Iter %d: DSE_wt_er = %8g = (%8g - %8g)/max(u_weight,c_weight)\n",
			//	 model->numberIteration, DSE_wt_er, u_weight, c_weight);
#endif
			if (u_weight >= 0.25 * c_weight)
			  break;
#ifdef JAJH_dev
			//printf(
			//       " !! JAJH RARE PRINT: Iter %d: DSE_wt_er = %8g from %8g, %8g with u_weight/c_weight = %g < 0.25\n",
			//       model->numberIteration, DSE_wt_er, u_weight, c_weight,
			//       u_weight / c_weight);
			n_wg_DSE_wt+=1;
#endif
		} else {
			//If not using DSE then accept the row by breaking out of the loop
			break;
		}
	}

	// Assign basic info
	columnOut = model->getBaseIndex()[rowOut];
	if (baseValue[rowOut] < baseLower[rowOut])
		deltaPrimal = baseValue[rowOut] - baseLower[rowOut];
	else
		deltaPrimal = baseValue[rowOut] - baseUpper[rowOut];
	sourceOut = deltaPrimal < 0 ? -1 : 1;
	row_epDensity *= 0.95;
	row_epDensity += 0.05 * row_ep.count / numRow;
}